

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O1

void __thiscall diff_match_patch_test::testMatchBitap(diff_match_patch_test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  int iVar2;
  diff_match_patch_test *pdVar3;
  long *local_80 [2];
  long local_70 [2];
  long *local_60 [2];
  long local_50 [2];
  wstring local_40;
  
  *(undefined8 *)&this->field_0x8 = 0x643f000000;
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_40,L"match_bitap: Exact match #1.",L"");
  local_60[0] = local_50;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_60,L"abcdefghijk",L"");
  local_80[0] = local_70;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_80,L"fgh",L"");
  pdVar3 = this;
  iVar2 = diff_match_patch::match_bitap((wstring *)this,(wstring *)local_60,(int)local_80);
  assertEquals(pdVar3,&local_40,5,iVar2);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] * 4 + 4);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_40,L"match_bitap: Exact match #2.",L"");
  local_60[0] = local_50;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_60,L"abcdefghijk",L"");
  local_80[0] = local_70;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_80,L"fgh",L"");
  pdVar3 = this;
  iVar2 = diff_match_patch::match_bitap((wstring *)this,(wstring *)local_60,(int)local_80);
  assertEquals(pdVar3,&local_40,5,iVar2);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] * 4 + 4);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_40,L"match_bitap: Fuzzy match #1.",L"");
  local_60[0] = local_50;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_60,L"abcdefghijk",L"");
  local_80[0] = local_70;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_80,L"efxhi",L"");
  pdVar3 = this;
  iVar2 = diff_match_patch::match_bitap((wstring *)this,(wstring *)local_60,(int)local_80);
  assertEquals(pdVar3,&local_40,4,iVar2);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] * 4 + 4);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_40,L"match_bitap: Fuzzy match #2.",L"");
  local_60[0] = local_50;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_60,L"abcdefghijk",L"");
  local_80[0] = local_70;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_80,L"cdefxyhijk",L"");
  pdVar3 = this;
  iVar2 = diff_match_patch::match_bitap((wstring *)this,(wstring *)local_60,(int)local_80);
  assertEquals(pdVar3,&local_40,2,iVar2);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] * 4 + 4);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_40,L"match_bitap: Fuzzy match #3.",L"");
  local_60[0] = local_50;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_60,L"abcdefghijk",L"");
  local_80[0] = local_70;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_80,L"bxy",L"");
  pdVar3 = this;
  iVar2 = diff_match_patch::match_bitap((wstring *)this,(wstring *)local_60,(int)local_80);
  assertEquals(pdVar3,&local_40,-1,iVar2);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] * 4 + 4);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_40,L"match_bitap: Overflow.",L"");
  local_60[0] = local_50;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_60,L"123456789xx0",L"");
  local_80[0] = local_70;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_80,L"3456789x0",L"");
  pdVar3 = this;
  iVar2 = diff_match_patch::match_bitap((wstring *)this,(wstring *)local_60,(int)local_80);
  assertEquals(pdVar3,&local_40,2,iVar2);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] * 4 + 4);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_40,L"match_bitap: Before start match.",L"");
  local_60[0] = local_50;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_60,L"abcdef",L"");
  local_80[0] = local_70;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_80,L"xxabc",L"");
  pdVar3 = this;
  iVar2 = diff_match_patch::match_bitap((wstring *)this,(wstring *)local_60,(int)local_80);
  assertEquals(pdVar3,&local_40,0,iVar2);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] * 4 + 4);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_40,L"match_bitap: Beyond end match.",L"");
  local_60[0] = local_50;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_60,L"abcdef",L"");
  local_80[0] = local_70;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_80,L"defyy",L"");
  pdVar3 = this;
  iVar2 = diff_match_patch::match_bitap((wstring *)this,(wstring *)local_60,(int)local_80);
  assertEquals(pdVar3,&local_40,3,iVar2);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] * 4 + 4);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_40,L"match_bitap: Oversized pattern.",L"");
  local_60[0] = local_50;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_60,L"abcdef",L"");
  local_80[0] = local_70;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_80,L"xabcdefy",L"");
  pdVar3 = this;
  iVar2 = diff_match_patch::match_bitap((wstring *)this,(wstring *)local_60,(int)local_80);
  assertEquals(pdVar3,&local_40,0,iVar2);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] * 4 + 4);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  *(undefined4 *)&this->field_0x8 = 0x3ecccccd;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_40,L"match_bitap: Threshold #1.",L"");
  local_60[0] = local_50;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_60,L"abcdefghijk",L"");
  local_80[0] = local_70;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_80,L"efxyhi",L"");
  pdVar3 = this;
  iVar2 = diff_match_patch::match_bitap((wstring *)this,(wstring *)local_60,(int)local_80);
  assertEquals(pdVar3,&local_40,4,iVar2);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] * 4 + 4);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  *(undefined4 *)&this->field_0x8 = 0x3e99999a;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_40,L"match_bitap: Threshold #2.",L"");
  local_60[0] = local_50;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_60,L"abcdefghijk",L"");
  local_80[0] = local_70;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_80,L"efxyhi",L"");
  pdVar3 = this;
  iVar2 = diff_match_patch::match_bitap((wstring *)this,(wstring *)local_60,(int)local_80);
  assertEquals(pdVar3,&local_40,-1,iVar2);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] * 4 + 4);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  *(undefined4 *)&this->field_0x8 = 0;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_40,L"match_bitap: Threshold #3.",L"");
  local_60[0] = local_50;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_60,L"abcdefghijk",L"");
  local_80[0] = local_70;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_80,L"bcdef",L"");
  pdVar3 = this;
  iVar2 = diff_match_patch::match_bitap((wstring *)this,(wstring *)local_60,(int)local_80);
  assertEquals(pdVar3,&local_40,1,iVar2);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] * 4 + 4);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  *(undefined4 *)&this->field_0x8 = 0x3f000000;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_40,L"match_bitap: Multiple select #1.",L"");
  local_60[0] = local_50;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_60,L"abcdexyzabcde",L"");
  local_80[0] = local_70;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_80,L"abccde",L"");
  pdVar3 = this;
  iVar2 = diff_match_patch::match_bitap((wstring *)this,(wstring *)local_60,(int)local_80);
  assertEquals(pdVar3,&local_40,0,iVar2);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] * 4 + 4);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_40,L"match_bitap: Multiple select #2.",L"");
  local_60[0] = local_50;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_60,L"abcdexyzabcde",L"");
  local_80[0] = local_70;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_80,L"abccde",L"");
  pdVar3 = this;
  iVar2 = diff_match_patch::match_bitap((wstring *)this,(wstring *)local_60,(int)local_80);
  assertEquals(pdVar3,&local_40,8,iVar2);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] * 4 + 4);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  *(undefined4 *)&this->field_0xc = 10;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_40,L"match_bitap: Distance test #1.",L"");
  local_60[0] = local_50;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)local_60,L"abcdefghijklmnopqrstuvwxyz",L"");
  local_80[0] = local_70;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_80,L"abcdefg",L"");
  pdVar3 = this;
  iVar2 = diff_match_patch::match_bitap((wstring *)this,(wstring *)local_60,(int)local_80);
  assertEquals(pdVar3,&local_40,-1,iVar2);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] * 4 + 4);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_40,L"match_bitap: Distance test #2.",L"");
  local_60[0] = local_50;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)local_60,L"abcdefghijklmnopqrstuvwxyz",L"");
  local_80[0] = local_70;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_80,L"abcdxxefg",L"");
  pdVar3 = this;
  iVar2 = diff_match_patch::match_bitap((wstring *)this,(wstring *)local_60,(int)local_80);
  assertEquals(pdVar3,&local_40,0,iVar2);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] * 4 + 4);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  *(undefined4 *)&this->field_0xc = 1000;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_40,L"match_bitap: Distance test #3.",L"");
  local_60[0] = local_50;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)local_60,L"abcdefghijklmnopqrstuvwxyz",L"");
  local_80[0] = local_70;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_80,L"abcdefg",L"");
  iVar2 = diff_match_patch::match_bitap((wstring *)this,(wstring *)local_60,(int)local_80);
  assertEquals(this,&local_40,0,iVar2);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] * 4 + 4);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  return;
}

Assistant:

void diff_match_patch_test::testMatchBitap() {
  // Bitap algorithm.
  dmp.Match_Distance = 100;
  dmp.Match_Threshold = 0.5f;
  assertEquals(L"match_bitap: Exact match #1.", 5, dmp.match_bitap(L"abcdefghijk", L"fgh", 5));

  assertEquals(L"match_bitap: Exact match #2.", 5, dmp.match_bitap(L"abcdefghijk", L"fgh", 0));

  assertEquals(L"match_bitap: Fuzzy match #1.", 4, dmp.match_bitap(L"abcdefghijk", L"efxhi", 0));

  assertEquals(L"match_bitap: Fuzzy match #2.", 2, dmp.match_bitap(L"abcdefghijk", L"cdefxyhijk", 5));

  assertEquals(L"match_bitap: Fuzzy match #3.", -1, dmp.match_bitap(L"abcdefghijk", L"bxy", 1));

  assertEquals(L"match_bitap: Overflow.", 2, dmp.match_bitap(L"123456789xx0", L"3456789x0", 2));

  assertEquals(L"match_bitap: Before start match.", 0, dmp.match_bitap(L"abcdef", L"xxabc", 4));

  assertEquals(L"match_bitap: Beyond end match.", 3, dmp.match_bitap(L"abcdef", L"defyy", 4));

  assertEquals(L"match_bitap: Oversized pattern.", 0, dmp.match_bitap(L"abcdef", L"xabcdefy", 0));

  dmp.Match_Threshold = 0.4f;
  assertEquals(L"match_bitap: Threshold #1.", 4, dmp.match_bitap(L"abcdefghijk", L"efxyhi", 1));

  dmp.Match_Threshold = 0.3f;
  assertEquals(L"match_bitap: Threshold #2.", -1, dmp.match_bitap(L"abcdefghijk", L"efxyhi", 1));

  dmp.Match_Threshold = 0.0f;
  assertEquals(L"match_bitap: Threshold #3.", 1, dmp.match_bitap(L"abcdefghijk", L"bcdef", 1));

  dmp.Match_Threshold = 0.5f;
  assertEquals(L"match_bitap: Multiple select #1.", 0, dmp.match_bitap(L"abcdexyzabcde", L"abccde", 3));

  assertEquals(L"match_bitap: Multiple select #2.", 8, dmp.match_bitap(L"abcdexyzabcde", L"abccde", 5));

  dmp.Match_Distance = 10;  // Strict location.
  assertEquals(L"match_bitap: Distance test #1.", -1, dmp.match_bitap(L"abcdefghijklmnopqrstuvwxyz", L"abcdefg", 24));

  assertEquals(L"match_bitap: Distance test #2.", 0, dmp.match_bitap(L"abcdefghijklmnopqrstuvwxyz", L"abcdxxefg", 1));

  dmp.Match_Distance = 1000;  // Loose location.
  assertEquals(L"match_bitap: Distance test #3.", 0, dmp.match_bitap(L"abcdefghijklmnopqrstuvwxyz", L"abcdefg", 24));
}